

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int on_ack_stream(quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent)

{
  int iVar1;
  quicly_sendstate_sent_t *args;
  quicly_stream_t *stream_00;
  quicly_conn_t *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  quicly_stream_t *stream;
  int ret;
  quicly_conn_t *conn;
  quicly_conn_t *in_stack_ffffffffffffffb8;
  quicly_stream_id_t in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  args = (quicly_sendstate_sent_t *)(in_RDI + -0x630);
  if (in_EDX == 0) {
    stream_00 = quicly_get_stream((quicly_conn_t *)
                                  CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                  in_stack_ffffffffffffffc0);
    if (stream_00 == (quicly_stream_t *)0x0) {
      return 0;
    }
    iVar1 = quicly_sendstate_lost((quicly_sendstate_t *)in_RCX,args);
    if (iVar1 != 0) {
      return iVar1;
    }
    if ((stream_00->_send_aux).reset_stream.sender_state == QUICLY_SENDER_STATE_NONE) {
      resched_stream_data(stream_00);
    }
  }
  else if ((((*(byte *)(in_RSI + 0x11) >> 1 & 1) == 0) ||
           (*(long *)(in_RDI + 0x3a0) != *(long *)&(in_RCX->super).state)) ||
          (*(long *)(in_RDI + 0x3b0) != *(long *)&(in_RCX->super).local.cid_set.plaintext)) {
    iVar1 = on_ack_stream_ack_cached(in_stack_ffffffffffffffb8);
    if (iVar1 != 0) {
      return iVar1;
    }
    if ((*(byte *)(in_RSI + 0x11) >> 1 & 1) == 0) {
      iVar1 = on_ack_stream_ack_one
                        (in_RCX,(quicly_stream_id_t)args,
                         (quicly_sendstate_sent_t *)(ulong)in_stack_ffffffffffffffc8);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    else {
      args[0x9d].start = *(uint64_t *)&(in_RCX->super).state;
      args[0x9d].end = *(uint64_t *)&(in_RCX->super).local.cid_set.plaintext;
      args[0x9e].start = (in_RCX->super).local.cid_set.plaintext.node_id;
    }
  }
  else {
    *(uint64_t *)(in_RDI + 0x3b0) = (in_RCX->super).local.cid_set.plaintext.node_id;
  }
  return 0;
}

Assistant:

static int on_ack_stream(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    int ret;

    if (acked) {

        QUICLY_PROBE(STREAM_ACKED, conn, conn->stash.now, sent->data.stream.stream_id, sent->data.stream.args.start,
                     sent->data.stream.args.end - sent->data.stream.args.start);

        if (packet->frames_in_flight && conn->stash.on_ack_stream.active_acked_cache.stream_id == sent->data.stream.stream_id &&
            conn->stash.on_ack_stream.active_acked_cache.args.end == sent->data.stream.args.start) {
            /* Fast path: append the newly supplied range to the existing cached range. */
            conn->stash.on_ack_stream.active_acked_cache.args.end = sent->data.stream.args.end;
        } else {
            /* Slow path: submit the cached range, and if possible, cache the newly supplied range. Else submit the newly supplied
             * range directly. */
            if ((ret = on_ack_stream_ack_cached(conn)) != 0)
                return ret;
            if (packet->frames_in_flight) {
                conn->stash.on_ack_stream.active_acked_cache.stream_id = sent->data.stream.stream_id;
                conn->stash.on_ack_stream.active_acked_cache.args = sent->data.stream.args;
            } else {
                if ((ret = on_ack_stream_ack_one(conn, sent->data.stream.stream_id, &sent->data.stream.args)) != 0)
                    return ret;
            }
        }

    } else {

        QUICLY_PROBE(STREAM_LOST, conn, conn->stash.now, sent->data.stream.stream_id, sent->data.stream.args.start,
                     sent->data.stream.args.end - sent->data.stream.args.start);

        quicly_stream_t *stream;
        if ((stream = quicly_get_stream(conn, sent->data.stream.stream_id)) == NULL)
            return 0;
        /* FIXME handle rto error */
        if ((ret = quicly_sendstate_lost(&stream->sendstate, &sent->data.stream.args)) != 0)
            return ret;
        if (stream->_send_aux.reset_stream.sender_state == QUICLY_SENDER_STATE_NONE)
            resched_stream_data(stream);
    }

    return 0;
}